

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_startSampleList(qpTestLog *log,char *name,char *description)

{
  deBool dVar1;
  qpXmlAttribute attribs [2];
  qpXmlAttribute local_68;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined8 local_30;
  
  deMutex_lock(log->lock);
  local_68.name = "Name";
  local_68.type = QP_XML_ATTRIBUTE_STRING;
  local_68.intValue = -0x2a6;
  local_68.boolValue = -1;
  local_48 = "Description";
  local_40 = 0;
  local_30 = 0xfffffffffffffd5a;
  local_68.stringValue = name;
  local_38 = description;
  dVar1 = qpXmlWriter_startElement(log->writer,"SampleList",2,&local_68);
  if (dVar1 == 0) {
    qpPrintf("qpTestLog_startSampleList(): Writing XML failed\n");
  }
  deMutex_unlock(log->lock);
  return (uint)(dVar1 != 0);
}

Assistant:

deBool qpTestLog_startSampleList (qpTestLog* log, const char* name, const char* description)
{
	int				numAttribs = 0;
	qpXmlAttribute	attribs[2];

	DE_ASSERT(log && name && description);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Description", description);

	if (!qpXmlWriter_startElement(log->writer, "SampleList", numAttribs, attribs))
	{
		qpPrintf("qpTestLog_startSampleList(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_push(&log->containerStack, CONTAINERTYPE_SAMPLELIST));

	deMutex_unlock(log->lock);
	return DE_TRUE;
}